

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to1.h
# Opt level: O2

void ncnn::im2col_sgemm_pack4to1_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  float fVar11;
  float fVar12;
  char cVar13;
  int *piVar14;
  int iVar15;
  _func_int ***ppp_Var16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  int q;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  undefined1 (*pauVar31) [16];
  long lVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  long lVar35;
  float afVar36 [4];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 local_f8 [64];
  size_t local_b8;
  ulong local_b0;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  int local_8c;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  void *local_70;
  ulong local_68;
  long local_60;
  Mat *local_58;
  ulong local_50;
  float zeros [4];
  
  uStack_80 = local_88;
  uStack_a0 = (ulong)local_a8;
  uVar7 = bottom_im2col->w;
  lVar32 = (long)(int)uVar7;
  uVar25 = bottom_im2col->h;
  local_88._4_4_ = 0;
  local_88._0_4_ = uVar25;
  uVar26 = bottom_im2col->c;
  local_68 = (ulong)top_blob->c;
  local_70 = _bias->data;
  local_b8 = 0;
  local_f8._0_8_ = (Allocator *)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_f8._24_4_ = 0;
  local_f8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if (lVar32 < 0xc) {
    if ((int)uVar7 < 8) {
      uVar17 = uVar7;
      if (3 < (int)uVar7) {
        uVar25 = uVar25 * 4;
        uVar17 = (uVar7 & 3) + 1;
      }
    }
    else {
      uVar25 = uVar25 * 8;
      uVar17 = (uVar7 & 3) + 1 + (uint)((uVar7 >> 2 & 1) != 0);
    }
  }
  else {
    uVar25 = uVar25 * 0xc;
    uVar17 = (uint)((ulong)uVar7 % 0xc);
    uVar17 = (uVar17 & 3) + (int)((ulong)uVar7 % 0xc >> 3) + uVar7 / 0xc +
             (uint)((uVar17 >> 2 & 1) != 0);
  }
  local_f8._32_8_ = local_f8._0_8_;
  local_f8._40_4_ = local_f8._8_4_;
  local_f8._44_4_ = local_f8._12_4_;
  local_b0 = (ulong)uVar26;
  local_58 = top_blob;
  Mat::create((Mat *)local_f8,uVar25,uVar26,uVar17,0x10,4,opt->workspace_allocator);
  uVar25 = (int)uVar7 / 0xc;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uStack_a0;
  _local_a8 = auVar37 << 0x40;
  uVar20 = 0;
  uVar28 = 0;
  if (0 < local_88._0_4_) {
    uVar28 = (ulong)local_88 & 0xffffffff;
  }
  uVar19 = 0;
  if (0 < (int)uVar26) {
    uVar19 = (ulong)uVar26;
  }
  uVar27 = 0;
  if (0 < (int)uVar25) {
    uVar27 = (ulong)uVar25;
  }
  lVar29 = (long)(int)(uVar7 * 4) * 4;
  for (; uVar20 != uVar27; uVar20 = uVar20 + 1) {
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_f8._0_8_ + local_b8 * uVar20 * local_f8._16_8_);
    for (uVar22 = 0; uVar22 != uVar19; uVar22 = uVar22 + 1) {
      pauVar34 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 +
                 ((long)(uVar20 * 0x3000000000) >> 0x1e) + 0xb0);
      uVar33 = uVar28;
      while (iVar30 = (int)uVar33, uVar33 = (ulong)(iVar30 - 1), iVar30 != 0) {
        auVar43 = vunpcklps_avx(pauVar34[-0xb],pauVar34[-10]);
        auVar51 = vunpcklps_avx(pauVar34[-9],pauVar34[-8]);
        auVar78 = vunpckhps_avx(pauVar34[-0xb],pauVar34[-10]);
        auVar52 = vunpckhps_avx(pauVar34[-9],pauVar34[-8]);
        auVar37 = vmovlhps_avx(auVar43,auVar51);
        auVar58 = vunpckhpd_avx(auVar43,auVar51);
        auVar43 = vmovlhps_avx(auVar78,auVar52);
        auVar66 = vunpckhpd_avx(auVar78,auVar52);
        auVar52 = vunpcklps_avx(pauVar34[-7],pauVar34[-6]);
        auVar59 = vunpcklps_avx(pauVar34[-5],pauVar34[-4]);
        auVar51 = vunpckhps_avx(pauVar34[-7],pauVar34[-6]);
        auVar50 = vunpckhps_avx(pauVar34[-5],pauVar34[-4]);
        auVar78 = vmovlhps_avx(auVar52,auVar59);
        auVar59 = vunpckhpd_avx(auVar52,auVar59);
        auVar52 = vmovlhps_avx(auVar51,auVar50);
        auVar44 = vunpckhpd_avx(auVar51,auVar50);
        auVar50 = vunpcklps_avx(pauVar34[-3],pauVar34[-2]);
        auVar74 = vunpcklps_avx(pauVar34[-1],*pauVar34);
        auVar60 = vunpckhps_avx(pauVar34[-3],pauVar34[-2]);
        auVar45 = vunpckhps_avx(pauVar34[-1],*pauVar34);
        auVar51 = vmovlhps_avx(auVar50,auVar74);
        auVar74 = vunpckhpd_avx(auVar50,auVar74);
        auVar50 = vmovlhps_avx(auVar60,auVar45);
        auVar60 = vunpckhpd_avx(auVar60,auVar45);
        *(undefined1 (*) [16])ppp_Var16 = auVar37;
        *(undefined1 (*) [16])(ppp_Var16 + 2) = auVar78;
        *(undefined1 (*) [16])(ppp_Var16 + 4) = auVar51;
        *(undefined1 (*) [16])(ppp_Var16 + 6) = auVar58;
        *(undefined1 (*) [16])(ppp_Var16 + 8) = auVar59;
        *(undefined1 (*) [16])(ppp_Var16 + 10) = auVar74;
        *(undefined1 (*) [16])(ppp_Var16 + 0xc) = auVar43;
        *(undefined1 (*) [16])(ppp_Var16 + 0xe) = auVar52;
        *(undefined1 (*) [16])(ppp_Var16 + 0x10) = auVar50;
        *(undefined1 (*) [16])(ppp_Var16 + 0x12) = auVar66;
        *(undefined1 (*) [16])(ppp_Var16 + 0x14) = auVar44;
        *(undefined1 (*) [16])(ppp_Var16 + 0x16) = auVar60;
        ppp_Var16 = ppp_Var16 + 0x18;
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar29);
      }
    }
  }
  iVar30 = uVar25 * 0xc;
  uVar25 = (int)uVar7 % 0xc >> 3;
  uVar27 = 0;
  uVar20 = (ulong)uVar25;
  if ((int)uVar25 < 1) {
    uVar20 = uVar27;
  }
  lVar35 = (long)iVar30 * 0x10 + 0x40;
  for (; uVar27 != uVar20; uVar27 = uVar27 + 1) {
    iVar15 = iVar30 + (int)uVar27 * 8;
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_f8._0_8_ +
                (long)((int)(char)((char)(iVar15 % 0xc) / '\b') + iVar15 / 0xc) * local_b8 *
                local_f8._16_8_);
    for (uVar22 = 0; uVar22 != uVar19; uVar22 = uVar22 + 1) {
      pauVar34 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + lVar35);
      uVar33 = uVar28;
      while (iVar15 = (int)uVar33, uVar33 = (ulong)(iVar15 - 1), iVar15 != 0) {
        auVar43 = vunpcklps_avx(pauVar34[-4],pauVar34[-3]);
        auVar51 = vunpcklps_avx(pauVar34[-2],pauVar34[-1]);
        auVar78 = vunpckhps_avx(pauVar34[-4],pauVar34[-3]);
        auVar52 = vunpckhps_avx(pauVar34[-2],pauVar34[-1]);
        auVar37 = vmovlhps_avx(auVar43,auVar51);
        auVar51 = vunpckhpd_avx(auVar43,auVar51);
        auVar43 = vmovlhps_avx(auVar78,auVar52);
        auVar50 = vunpckhpd_avx(auVar78,auVar52);
        auVar52 = vunpcklps_avx(*pauVar34,pauVar34[1]);
        auVar58 = vunpcklps_avx(pauVar34[2],pauVar34[3]);
        auVar66 = vunpckhps_avx(*pauVar34,pauVar34[1]);
        auVar59 = vunpckhps_avx(pauVar34[2],pauVar34[3]);
        auVar78 = vmovlhps_avx(auVar52,auVar58);
        auVar58 = vunpckhpd_avx(auVar52,auVar58);
        auVar52 = vmovlhps_avx(auVar66,auVar59);
        auVar66 = vunpckhpd_avx(auVar66,auVar59);
        *(undefined1 (*) [16])ppp_Var16 = auVar37;
        *(undefined1 (*) [16])(ppp_Var16 + 2) = auVar78;
        *(undefined1 (*) [16])(ppp_Var16 + 4) = auVar51;
        *(undefined1 (*) [16])(ppp_Var16 + 6) = auVar58;
        *(undefined1 (*) [16])(ppp_Var16 + 8) = auVar43;
        *(undefined1 (*) [16])(ppp_Var16 + 10) = auVar52;
        *(undefined1 (*) [16])(ppp_Var16 + 0xc) = auVar50;
        *(undefined1 (*) [16])(ppp_Var16 + 0xe) = auVar66;
        ppp_Var16 = ppp_Var16 + 0x10;
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar29);
      }
    }
    lVar35 = lVar35 + 0x80;
  }
  iVar30 = ((int)uVar7 % 0xc & 0xfffffff8U) + iVar30;
  uVar25 = uVar7 - iVar30;
  local_a8._0_4_ = uVar25;
  uVar27 = 0;
  uVar20 = (ulong)(uint)((int)uVar25 >> 2);
  if ((int)uVar25 >> 2 < 1) {
    uVar20 = uVar27;
  }
  lVar35 = (long)iVar30 * 0x10 + 0x20;
  for (; uVar27 != uVar20; uVar27 = uVar27 + 1) {
    iVar15 = iVar30 + (int)uVar27 * 4;
    cVar13 = (char)(iVar15 % 0xc);
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_f8._0_8_ +
                (long)((int)(char)(cVar13 % '\b' >> 2) + iVar15 / 0xc + (int)(cVar13 / '\b')) *
                local_b8 * local_f8._16_8_);
    for (uVar22 = 0; uVar22 != uVar19; uVar22 = uVar22 + 1) {
      pauVar34 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar22 + lVar35);
      uVar33 = uVar28;
      while (iVar15 = (int)uVar33, uVar33 = (ulong)(iVar15 - 1), iVar15 != 0) {
        auVar43 = vunpcklps_avx(pauVar34[-2],pauVar34[-1]);
        auVar78 = vunpcklps_avx(*pauVar34,pauVar34[1]);
        auVar52 = vunpckhps_avx(pauVar34[-2],pauVar34[-1]);
        auVar51 = vunpckhps_avx(*pauVar34,pauVar34[1]);
        auVar37 = vmovlhps_avx(auVar43,auVar78);
        auVar78 = vunpckhpd_avx(auVar43,auVar78);
        auVar43 = vmovlhps_avx(auVar52,auVar51);
        auVar52 = vunpckhpd_avx(auVar52,auVar51);
        *(undefined1 (*) [16])ppp_Var16 = auVar37;
        *(undefined1 (*) [16])(ppp_Var16 + 2) = auVar78;
        *(undefined1 (*) [16])(ppp_Var16 + 4) = auVar43;
        *(undefined1 (*) [16])(ppp_Var16 + 6) = auVar52;
        ppp_Var16 = ppp_Var16 + 8;
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar29);
      }
    }
    lVar35 = lVar35 + 0x40;
  }
  uVar20 = (ulong)(int)((uVar25 & 0xfffffffc) + iVar30);
  lVar35 = uVar20 << 4;
  for (; (long)uVar20 < lVar32; uVar20 = uVar20 + 1) {
    uVar27 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
    cVar13 = (char)((long)uVar27 % 0xc);
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_f8._0_8_ +
                (long)((int)(cVar13 % '\x04') + (int)((long)uVar27 / 0xc) + (int)(cVar13 / '\b') +
                      (int)(char)((cVar13 % '\b') / '\x04')) * local_b8 * local_f8._16_8_);
    for (uVar27 = 0; uVar27 != uVar19; uVar27 = uVar27 + 1) {
      pauVar34 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar27 + lVar35);
      uVar22 = uVar28;
      while (iVar30 = (int)uVar22, uVar22 = (ulong)(iVar30 - 1), iVar30 != 0) {
        *(undefined1 (*) [16])ppp_Var16 = *pauVar34;
        ppp_Var16 = ppp_Var16 + 2;
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + lVar29);
      }
    }
    lVar35 = lVar35 + 0x10;
  }
  uVar20 = (ulong)(uint)((int)local_68 >> 0x1f) << 0x20 | local_68 & 0xffffffff;
  uVar28 = (long)uVar20 / 4;
  uVar20 = (long)uVar20 % 4 & 0xffffffff;
  uVar25 = (int)local_b0 * local_88._0_4_;
  local_b0 = (ulong)uVar25;
  uVar27 = 0;
  uVar19 = (ulong)(uVar25 * 4);
  if ((int)(uVar25 * 4) < 1) {
    uVar19 = uVar27;
  }
  local_8c = (int)uVar28;
  local_50 = 0;
  if (0 < local_8c) {
    local_50 = uVar28 & 0xffffffff;
  }
  local_60 = lVar32 + -0xb;
  for (; iVar30 = (int)uVar19, uVar27 != local_50; uVar27 = uVar27 + 1) {
    sVar8 = local_58->cstep;
    pvVar9 = local_58->data;
    sVar10 = local_58->elemsize;
    pauVar18 = (undefined1 (*) [16])(uVar27 * 4 * sVar8 * sVar10 + (long)pvVar9);
    pauVar24 = (undefined1 (*) [16])((uVar27 * 4 + 1) * sVar8 * sVar10 + (long)pvVar9);
    pauVar31 = (undefined1 (*) [16])((uVar27 * 4 + 2) * sVar8 * sVar10 + (long)pvVar9);
    pauVar23 = (undefined1 (*) [16])((uVar27 * 4 + 3) * sVar8 * sVar10 + (long)pvVar9);
    afVar36 = (float  [4])(ZEXT816(0) << 0x40);
    zeros[0] = afVar36[0];
    zeros[1] = afVar36[1];
    zeros[2] = afVar36[2];
    zeros[3] = afVar36[3];
    pauVar34 = (undefined1 (*) [16])(uVar27 * 0x10 + (long)local_70);
    if (local_70 == (void *)0x0) {
      pauVar34 = (undefined1 (*) [16])zeros;
    }
    for (uVar28 = 0; (long)uVar28 < local_60; uVar28 = uVar28 + 0xc) {
      ppp_Var16 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ + (uVar28 / 0xc) * local_b8 * local_f8._16_8_
                  );
      pfVar21 = (float *)(kernel->cstep * uVar27 * kernel->elemsize + (long)kernel->data);
      uVar2 = *(undefined4 *)*pauVar34;
      auVar60._4_4_ = uVar2;
      auVar60._0_4_ = uVar2;
      auVar60._8_4_ = uVar2;
      auVar60._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 4);
      auVar74._4_4_ = uVar2;
      auVar74._0_4_ = uVar2;
      auVar74._8_4_ = uVar2;
      auVar74._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 8);
      local_a8._4_4_ = uVar2;
      local_a8._0_4_ = uVar2;
      uStack_a0._0_4_ = (float)uVar2;
      uStack_a0._4_4_ = (float)uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 0xc);
      auVar78._4_4_ = uVar2;
      auVar78._0_4_ = uVar2;
      auVar78._8_4_ = uVar2;
      auVar78._12_4_ = uVar2;
      uVar20 = uVar19;
      auVar37 = _local_a8;
      auVar43 = auVar78;
      auVar52 = auVar74;
      auVar51 = auVar74;
      auVar50 = auVar60;
      auVar58 = auVar60;
      auVar66 = auVar78;
      _local_88 = _local_a8;
      while( true ) {
        iVar15 = (int)uVar20;
        uVar20 = (ulong)(iVar15 - 1);
        if (iVar15 == 0) break;
        fVar5 = *(float *)ppp_Var16;
        fVar6 = *(float *)((long)ppp_Var16 + 4);
        fVar11 = *(float *)(ppp_Var16 + 1);
        fVar12 = *(float *)((long)(ppp_Var16 + 1) + 4);
        auVar59 = *(undefined1 (*) [16])(ppp_Var16 + 2);
        auVar44 = *(undefined1 (*) [16])(ppp_Var16 + 4);
        fVar3 = *pfVar21;
        auVar77._0_4_ = auVar58._0_4_ + fVar5 * fVar3;
        auVar77._4_4_ = auVar58._4_4_ + fVar6 * fVar3;
        auVar77._8_4_ = auVar58._8_4_ + fVar11 * fVar3;
        auVar77._12_4_ = auVar58._12_4_ + fVar12 * fVar3;
        fVar80 = auVar59._0_4_;
        fVar81 = auVar59._4_4_;
        fVar82 = auVar59._8_4_;
        fVar83 = auVar59._12_4_;
        auVar76._0_4_ = auVar50._0_4_ + fVar80 * fVar3;
        auVar76._4_4_ = auVar50._4_4_ + fVar81 * fVar3;
        auVar76._8_4_ = auVar50._8_4_ + fVar82 * fVar3;
        auVar76._12_4_ = auVar50._12_4_ + fVar83 * fVar3;
        fVar4 = pfVar21[1];
        fVar84 = auVar44._0_4_;
        fVar85 = auVar44._4_4_;
        fVar86 = auVar44._8_4_;
        fVar87 = auVar44._12_4_;
        auVar61._0_4_ = fVar84 * fVar3 + auVar60._0_4_;
        auVar61._4_4_ = fVar85 * fVar3 + auVar60._4_4_;
        auVar61._8_4_ = fVar86 * fVar3 + auVar60._8_4_;
        auVar61._12_4_ = fVar87 * fVar3 + auVar60._12_4_;
        auVar75._0_4_ = auVar51._0_4_ + fVar5 * fVar4;
        auVar75._4_4_ = auVar51._4_4_ + fVar6 * fVar4;
        auVar75._8_4_ = auVar51._8_4_ + fVar11 * fVar4;
        auVar75._12_4_ = auVar51._12_4_ + fVar12 * fVar4;
        auVar73._0_4_ = auVar52._0_4_ + fVar80 * fVar4;
        auVar73._4_4_ = auVar52._4_4_ + fVar81 * fVar4;
        auVar73._8_4_ = auVar52._8_4_ + fVar82 * fVar4;
        auVar73._12_4_ = auVar52._12_4_ + fVar83 * fVar4;
        fVar3 = pfVar21[2];
        auVar53._0_4_ = fVar84 * fVar4 + auVar74._0_4_;
        auVar53._4_4_ = fVar85 * fVar4 + auVar74._4_4_;
        auVar53._8_4_ = fVar86 * fVar4 + auVar74._8_4_;
        auVar53._12_4_ = fVar87 * fVar4 + auVar74._12_4_;
        local_a8._4_4_ = fVar6 * fVar3 + (float)local_a8._4_4_;
        local_a8._0_4_ = fVar5 * fVar3 + (float)local_a8._0_4_;
        uStack_a0._0_4_ = fVar11 * fVar3 + (float)uStack_a0;
        uStack_a0._4_4_ = fVar12 * fVar3 + uStack_a0._4_4_;
        local_88._4_4_ = fVar81 * fVar3 + (float)local_88._4_4_;
        local_88._0_4_ = fVar80 * fVar3 + (float)local_88._0_4_;
        uStack_80._0_4_ = fVar82 * fVar3 + (float)uStack_80;
        uStack_80._4_4_ = fVar83 * fVar3 + uStack_80._4_4_;
        auVar68._0_4_ = fVar84 * fVar3 + auVar37._0_4_;
        auVar68._4_4_ = fVar85 * fVar3 + auVar37._4_4_;
        auVar68._8_4_ = fVar86 * fVar3 + auVar37._8_4_;
        auVar68._12_4_ = fVar87 * fVar3 + auVar37._12_4_;
        fVar3 = pfVar21[3];
        auVar79._0_4_ = fVar5 * fVar3 + auVar66._0_4_;
        auVar79._4_4_ = fVar6 * fVar3 + auVar66._4_4_;
        auVar79._8_4_ = fVar11 * fVar3 + auVar66._8_4_;
        auVar79._12_4_ = fVar12 * fVar3 + auVar66._12_4_;
        auVar71._0_4_ = auVar43._0_4_ + fVar80 * fVar3;
        auVar71._4_4_ = auVar43._4_4_ + fVar81 * fVar3;
        auVar71._8_4_ = auVar43._8_4_ + fVar82 * fVar3;
        auVar71._12_4_ = auVar43._12_4_ + fVar83 * fVar3;
        auVar45._0_4_ = fVar84 * fVar3 + auVar78._0_4_;
        auVar45._4_4_ = fVar85 * fVar3 + auVar78._4_4_;
        auVar45._8_4_ = fVar86 * fVar3 + auVar78._8_4_;
        auVar45._12_4_ = fVar87 * fVar3 + auVar78._12_4_;
        ppp_Var16 = ppp_Var16 + 6;
        pfVar21 = pfVar21 + 4;
        auVar78 = auVar45;
        auVar74 = auVar53;
        auVar60 = auVar61;
        auVar37 = auVar68;
        auVar43 = auVar71;
        auVar52 = auVar73;
        auVar51 = auVar75;
        auVar50 = auVar76;
        auVar58 = auVar77;
        auVar66 = auVar79;
      }
      *pauVar18 = auVar58;
      pauVar18[1] = auVar50;
      pauVar18[2] = auVar60;
      *pauVar24 = auVar51;
      pauVar24[1] = auVar52;
      pauVar24[2] = auVar74;
      *(undefined1 (*) [8])*pauVar31 = local_a8;
      *(ulong *)((long)*pauVar31 + 8) = uStack_a0;
      pauVar31[1] = _local_88;
      pauVar31[2] = auVar37;
      *pauVar23 = auVar66;
      pauVar23[1] = auVar43;
      pauVar23[2] = auVar78;
      pauVar18 = pauVar18 + 3;
      pauVar24 = pauVar24 + 3;
      pauVar31 = pauVar31 + 3;
      pauVar23 = pauVar23 + 3;
    }
    while( true ) {
      if ((int)uVar7 <= (int)uVar28 + 7) break;
      uVar2 = *(undefined4 *)*pauVar34;
      auVar54._4_4_ = uVar2;
      auVar54._0_4_ = uVar2;
      auVar54._8_4_ = uVar2;
      auVar54._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 4);
      auVar46._4_4_ = uVar2;
      auVar46._0_4_ = uVar2;
      auVar46._8_4_ = uVar2;
      auVar46._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 8);
      auVar38._4_4_ = uVar2;
      auVar38._0_4_ = uVar2;
      auVar38._8_4_ = uVar2;
      auVar38._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 0xc);
      auVar62._4_4_ = uVar2;
      auVar62._0_4_ = uVar2;
      auVar62._8_4_ = uVar2;
      auVar62._12_4_ = uVar2;
      lVar29 = local_b8 * local_f8._16_8_ *
               (ulong)((int)((uVar28 & 0xffffffff) / 0xc) +
                      ((uint)((uVar28 & 0xffffffff) % 0xc) >> 3));
      lVar32 = kernel->cstep * uVar27 * kernel->elemsize;
      pvVar9 = kernel->data;
      lVar35 = 0;
      uVar20 = uVar19;
      auVar37 = auVar54;
      auVar43 = auVar46;
      auVar78 = auVar38;
      auVar52 = auVar62;
      while (iVar15 = (int)uVar20, uVar20 = (ulong)(iVar15 - 1), iVar15 != 0) {
        pfVar21 = (float *)((long)(_func_int ***)local_f8._0_8_ + lVar35 * 2 + lVar29);
        fVar82 = *pfVar21;
        fVar83 = pfVar21[1];
        fVar84 = pfVar21[2];
        fVar85 = pfVar21[3];
        auVar51 = *(undefined1 (*) [16])
                   ((long)&((Allocator *)(local_f8._0_8_ + 0x10))->_vptr_Allocator +
                   lVar35 * 2 + lVar29);
        fVar3 = *(float *)((long)pvVar9 + lVar35 + lVar32);
        fVar4 = *(float *)((long)pvVar9 + lVar35 + lVar32 + 4);
        fVar5 = *(float *)((long)pvVar9 + lVar35 + lVar32 + 8);
        fVar6 = *(float *)((long)pvVar9 + lVar35 + lVar32 + 0xc);
        auVar55._0_4_ = fVar3 * fVar82 + auVar54._0_4_;
        auVar55._4_4_ = fVar3 * fVar83 + auVar54._4_4_;
        auVar55._8_4_ = fVar3 * fVar84 + auVar54._8_4_;
        auVar55._12_4_ = fVar3 * fVar85 + auVar54._12_4_;
        fVar11 = auVar51._0_4_;
        fVar12 = auVar51._4_4_;
        fVar80 = auVar51._8_4_;
        fVar81 = auVar51._12_4_;
        auVar67._0_4_ = fVar3 * fVar11 + auVar37._0_4_;
        auVar67._4_4_ = fVar3 * fVar12 + auVar37._4_4_;
        auVar67._8_4_ = fVar3 * fVar80 + auVar37._8_4_;
        auVar67._12_4_ = fVar3 * fVar81 + auVar37._12_4_;
        auVar47._0_4_ = fVar4 * fVar82 + auVar46._0_4_;
        auVar47._4_4_ = fVar4 * fVar83 + auVar46._4_4_;
        auVar47._8_4_ = fVar4 * fVar84 + auVar46._8_4_;
        auVar47._12_4_ = fVar4 * fVar85 + auVar46._12_4_;
        auVar69._0_4_ = fVar4 * fVar11 + auVar43._0_4_;
        auVar69._4_4_ = fVar4 * fVar12 + auVar43._4_4_;
        auVar69._8_4_ = fVar4 * fVar80 + auVar43._8_4_;
        auVar69._12_4_ = fVar4 * fVar81 + auVar43._12_4_;
        auVar39._0_4_ = fVar5 * fVar82 + auVar38._0_4_;
        auVar39._4_4_ = fVar5 * fVar83 + auVar38._4_4_;
        auVar39._8_4_ = fVar5 * fVar84 + auVar38._8_4_;
        auVar39._12_4_ = fVar5 * fVar85 + auVar38._12_4_;
        auVar70._0_4_ = fVar5 * fVar11 + auVar78._0_4_;
        auVar70._4_4_ = fVar5 * fVar12 + auVar78._4_4_;
        auVar70._8_4_ = fVar5 * fVar80 + auVar78._8_4_;
        auVar70._12_4_ = fVar5 * fVar81 + auVar78._12_4_;
        auVar63._0_4_ = fVar6 * fVar82 + auVar62._0_4_;
        auVar63._4_4_ = fVar6 * fVar83 + auVar62._4_4_;
        auVar63._8_4_ = fVar6 * fVar84 + auVar62._8_4_;
        auVar63._12_4_ = fVar6 * fVar85 + auVar62._12_4_;
        auVar72._0_4_ = auVar52._0_4_ + fVar6 * fVar11;
        auVar72._4_4_ = auVar52._4_4_ + fVar6 * fVar12;
        auVar72._8_4_ = auVar52._8_4_ + fVar6 * fVar80;
        auVar72._12_4_ = auVar52._12_4_ + fVar6 * fVar81;
        lVar35 = lVar35 + 0x10;
        auVar38 = auVar39;
        auVar46 = auVar47;
        auVar54 = auVar55;
        auVar62 = auVar63;
        auVar37 = auVar67;
        auVar43 = auVar69;
        auVar78 = auVar70;
        auVar52 = auVar72;
      }
      *pauVar18 = auVar54;
      pauVar18[1] = auVar37;
      *pauVar24 = auVar46;
      pauVar24[1] = auVar43;
      *pauVar31 = auVar38;
      pauVar31[1] = auVar78;
      *pauVar23 = auVar62;
      pauVar23[1] = auVar52;
      pauVar18 = pauVar18 + 2;
      pauVar24 = pauVar24 + 2;
      pauVar31 = pauVar31 + 2;
      pauVar23 = pauVar23 + 2;
      uVar28 = (ulong)((int)uVar28 + 8);
    }
    while( true ) {
      uVar20 = (uVar28 & 0xffffffff) % 0xc;
      if ((int)uVar7 <= (int)((uint)uVar28 | 3)) break;
      uVar2 = *(undefined4 *)*pauVar34;
      auVar40._4_4_ = uVar2;
      auVar40._0_4_ = uVar2;
      auVar40._8_4_ = uVar2;
      auVar40._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 4);
      auVar48._4_4_ = uVar2;
      auVar48._0_4_ = uVar2;
      auVar48._8_4_ = uVar2;
      auVar48._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 8);
      auVar56._4_4_ = uVar2;
      auVar56._0_4_ = uVar2;
      auVar56._8_4_ = uVar2;
      auVar56._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(*pauVar34 + 0xc);
      auVar64._4_4_ = uVar2;
      auVar64._0_4_ = uVar2;
      auVar64._8_4_ = uVar2;
      auVar64._12_4_ = uVar2;
      lVar32 = kernel->cstep * uVar27 * kernel->elemsize;
      pvVar9 = kernel->data;
      lVar29 = 0;
      uVar22 = uVar19;
      while (iVar15 = (int)uVar22, uVar22 = (ulong)(iVar15 - 1), iVar15 != 0) {
        pfVar21 = (float *)((long)(_func_int ***)local_f8._0_8_ +
                           lVar29 + local_b8 * local_f8._16_8_ *
                                    (ulong)((int)(uVar20 >> 3) + (int)((uVar28 & 0xffffffff) / 0xc)
                                           + (uint)(((uint)uVar20 >> 2 & 1) != 0)));
        fVar11 = *pfVar21;
        fVar12 = pfVar21[1];
        fVar80 = pfVar21[2];
        fVar81 = pfVar21[3];
        fVar3 = *(float *)((long)pvVar9 + lVar29 + lVar32);
        fVar4 = *(float *)((long)pvVar9 + lVar29 + lVar32 + 4);
        fVar5 = *(float *)((long)pvVar9 + lVar29 + lVar32 + 8);
        fVar6 = *(float *)((long)pvVar9 + lVar29 + lVar32 + 0xc);
        auVar41._0_4_ = fVar3 * fVar11 + auVar40._0_4_;
        auVar41._4_4_ = fVar3 * fVar12 + auVar40._4_4_;
        auVar41._8_4_ = fVar3 * fVar80 + auVar40._8_4_;
        auVar41._12_4_ = fVar3 * fVar81 + auVar40._12_4_;
        auVar49._0_4_ = fVar4 * fVar11 + auVar48._0_4_;
        auVar49._4_4_ = fVar4 * fVar12 + auVar48._4_4_;
        auVar49._8_4_ = fVar4 * fVar80 + auVar48._8_4_;
        auVar49._12_4_ = fVar4 * fVar81 + auVar48._12_4_;
        auVar57._0_4_ = fVar5 * fVar11 + auVar56._0_4_;
        auVar57._4_4_ = fVar5 * fVar12 + auVar56._4_4_;
        auVar57._8_4_ = fVar5 * fVar80 + auVar56._8_4_;
        auVar57._12_4_ = fVar5 * fVar81 + auVar56._12_4_;
        auVar65._0_4_ = fVar6 * fVar11 + auVar64._0_4_;
        auVar65._4_4_ = fVar6 * fVar12 + auVar64._4_4_;
        auVar65._8_4_ = fVar6 * fVar80 + auVar64._8_4_;
        auVar65._12_4_ = fVar6 * fVar81 + auVar64._12_4_;
        lVar29 = lVar29 + 0x10;
        auVar40 = auVar41;
        auVar48 = auVar49;
        auVar56 = auVar57;
        auVar64 = auVar65;
      }
      *pauVar18 = auVar40;
      *pauVar24 = auVar48;
      *pauVar31 = auVar56;
      *pauVar23 = auVar64;
      pauVar18 = pauVar18 + 1;
      pauVar24 = pauVar24 + 1;
      pauVar31 = pauVar31 + 1;
      pauVar23 = pauVar23 + 1;
      uVar28 = (ulong)((uint)uVar28 + 4);
    }
    sVar8 = kernel->cstep;
    sVar10 = kernel->elemsize;
    pvVar9 = kernel->data;
    while( true ) {
      uVar26 = (uint)uVar28;
      uVar20 = (uVar28 & 0xffffffff) % 0xc;
      if ((int)uVar7 <= (int)uVar26) break;
      pfVar21 = (float *)(sVar8 * uVar27 * sVar10 + (long)pvVar9);
      auVar37 = *pauVar34;
      for (lVar32 = 0; iVar30 != (int)lVar32; lVar32 = lVar32 + 1) {
        fVar3 = *(float *)((long)(_func_int ***)local_f8._0_8_ +
                          lVar32 * 4 +
                          (ulong)((uVar26 & 3) +
                                  (int)(uVar20 >> 3) + (int)((uVar28 & 0xffffffff) / 0xc) +
                                 (uint)(((uint)uVar20 >> 2 & 1) != 0)) * local_b8 * local_f8._16_8_)
        ;
        auVar42._0_4_ = fVar3 * *pfVar21 + auVar37._0_4_;
        auVar42._4_4_ = fVar3 * pfVar21[1] + auVar37._4_4_;
        auVar42._8_4_ = fVar3 * pfVar21[2] + auVar37._8_4_;
        auVar42._12_4_ = fVar3 * pfVar21[3] + auVar37._12_4_;
        pfVar21 = pfVar21 + 4;
        auVar37 = auVar42;
      }
      *(float *)*pauVar18 = auVar37._0_4_;
      uVar2 = vextractps_avx(auVar37,1);
      *(undefined4 *)*pauVar24 = uVar2;
      uVar2 = vextractps_avx(auVar37,2);
      *(undefined4 *)*pauVar31 = uVar2;
      uVar2 = vextractps_avx(auVar37,3);
      *(undefined4 *)*pauVar23 = uVar2;
      pauVar18 = (undefined1 (*) [16])((long)*pauVar18 + 4);
      pauVar24 = (undefined1 (*) [16])((long)*pauVar24 + 4);
      pauVar31 = (undefined1 (*) [16])((long)*pauVar31 + 4);
      pauVar23 = (undefined1 (*) [16])((long)*pauVar23 + 4);
      uVar28 = (ulong)(uVar26 + 1);
    }
  }
  uVar28 = local_b0;
  if ((int)uVar25 < 1) {
    uVar28 = 0;
  }
  for (uVar19 = (ulong)(local_8c << 2); (long)uVar19 < (long)local_68; uVar19 = uVar19 + 1) {
    if (local_70 == (void *)0x0) {
      auVar37 = ZEXT816(0) << 0x40;
    }
    else {
      auVar37 = ZEXT416(*(uint *)((long)local_70 + uVar19 * 4));
    }
    pauVar34 = (undefined1 (*) [16])
               (local_58->cstep * uVar19 * local_58->elemsize + (long)local_58->data);
    uVar20 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
    lVar32 = (long)((int)((long)uVar20 % 4) + (int)((long)uVar20 / 4));
    auVar43 = vshufps_avx(auVar37,auVar37,0);
    for (uVar27 = 0; (long)uVar27 < local_60; uVar27 = uVar27 + 0xc) {
      ppp_Var16 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ + (uVar27 / 0xc) * local_b8 * local_f8._16_8_
                  );
      auVar78 = auVar43;
      auVar52 = auVar43;
      auVar51 = auVar43;
      for (lVar29 = 0; iVar30 != (int)lVar29; lVar29 = lVar29 + 1) {
        fVar3 = *(float *)((long)kernel->data +
                          lVar29 * 4 + kernel->cstep * lVar32 * kernel->elemsize);
        auVar50._0_4_ = fVar3 * *(float *)ppp_Var16 + auVar78._0_4_;
        auVar50._4_4_ = fVar3 * *(float *)((long)ppp_Var16 + 4) + auVar78._4_4_;
        auVar50._8_4_ = fVar3 * *(float *)(ppp_Var16 + 1) + auVar78._8_4_;
        auVar50._12_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 1) + 4) + auVar78._12_4_;
        auVar58._0_4_ = fVar3 * *(float *)(ppp_Var16 + 2) + auVar52._0_4_;
        auVar58._4_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 2) + 4) + auVar52._4_4_;
        auVar58._8_4_ = fVar3 * *(float *)(ppp_Var16 + 3) + auVar52._8_4_;
        auVar58._12_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 3) + 4) + auVar52._12_4_;
        auVar66._0_4_ = fVar3 * *(float *)(ppp_Var16 + 4) + auVar51._0_4_;
        auVar66._4_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 4) + 4) + auVar51._4_4_;
        auVar66._8_4_ = fVar3 * *(float *)(ppp_Var16 + 5) + auVar51._8_4_;
        auVar66._12_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 5) + 4) + auVar51._12_4_;
        ppp_Var16 = ppp_Var16 + 6;
        auVar78 = auVar50;
        auVar52 = auVar58;
        auVar51 = auVar66;
      }
      *pauVar34 = auVar78;
      pauVar34[1] = auVar52;
      pauVar34[2] = auVar51;
      pauVar34 = pauVar34 + 3;
    }
    for (; (int)uVar27 + 7 < (int)uVar7; uVar27 = (ulong)((int)uVar27 + 8)) {
      ppp_Var16 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ +
                  (uint)((int)((uVar27 & 0xffffffff) % 0xc >> 3) +
                        (int)((uVar27 & 0xffffffff) / 0xc)) * local_b8 * local_f8._16_8_);
      auVar78 = auVar43;
      auVar52 = auVar43;
      for (lVar29 = 0; iVar30 != (int)lVar29; lVar29 = lVar29 + 1) {
        fVar3 = *(float *)((long)kernel->data +
                          lVar29 * 4 + kernel->cstep * lVar32 * kernel->elemsize);
        auVar51._0_4_ = fVar3 * *(float *)ppp_Var16 + auVar78._0_4_;
        auVar51._4_4_ = fVar3 * *(float *)((long)ppp_Var16 + 4) + auVar78._4_4_;
        auVar51._8_4_ = fVar3 * *(float *)(ppp_Var16 + 1) + auVar78._8_4_;
        auVar51._12_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 1) + 4) + auVar78._12_4_;
        auVar59._0_4_ = fVar3 * *(float *)(ppp_Var16 + 2) + auVar52._0_4_;
        auVar59._4_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 2) + 4) + auVar52._4_4_;
        auVar59._8_4_ = fVar3 * *(float *)(ppp_Var16 + 3) + auVar52._8_4_;
        auVar59._12_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 3) + 4) + auVar52._12_4_;
        ppp_Var16 = ppp_Var16 + 4;
        auVar78 = auVar51;
        auVar52 = auVar59;
      }
      *pauVar34 = auVar78;
      pauVar34[1] = auVar52;
      pauVar34 = pauVar34 + 2;
    }
    for (; (int)((uint)uVar27 | 3) < (int)uVar7; uVar27 = (ulong)((uint)uVar27 + 4)) {
      uVar20 = (uVar27 & 0xffffffff) % 0xc;
      ppp_Var16 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ +
                  ((int)(uVar20 >> 3) + (int)((uVar27 & 0xffffffff) / 0xc) +
                  (uint)(((uint)uVar20 >> 2 & 1) != 0)) * local_b8 * local_f8._16_8_);
      auVar78 = auVar43;
      for (lVar29 = 0; iVar30 != (int)lVar29; lVar29 = lVar29 + 1) {
        fVar3 = *(float *)((long)kernel->data +
                          lVar29 * 4 + kernel->cstep * lVar32 * kernel->elemsize);
        auVar52._0_4_ = fVar3 * *(float *)ppp_Var16 + auVar78._0_4_;
        auVar52._4_4_ = fVar3 * *(float *)((long)ppp_Var16 + 4) + auVar78._4_4_;
        auVar52._8_4_ = fVar3 * *(float *)(ppp_Var16 + 1) + auVar78._8_4_;
        auVar52._12_4_ = fVar3 * *(float *)((long)(ppp_Var16 + 1) + 4) + auVar78._12_4_;
        ppp_Var16 = ppp_Var16 + 2;
        auVar78 = auVar52;
      }
      *pauVar34 = auVar78;
      pauVar34 = pauVar34 + 1;
    }
    sVar8 = kernel->cstep;
    sVar10 = kernel->elemsize;
    pvVar9 = kernel->data;
    while( true ) {
      uVar25 = (uint)uVar27;
      uVar20 = (uVar27 & 0xffffffff) % 0xc;
      if ((int)uVar7 <= (int)uVar25) break;
      auVar43 = ZEXT816(0) << 0x40;
      lVar29 = 0;
      uVar22 = uVar28;
      while( true ) {
        iVar15 = (int)uVar22;
        uVar22 = (ulong)(iVar15 - 1);
        fVar3 = auVar43._4_4_;
        fVar4 = auVar43._8_4_;
        fVar5 = auVar43._12_4_;
        if (iVar15 == 0) break;
        pfVar21 = (float *)((long)pvVar9 + lVar29 + lVar32 * sVar8 * sVar10);
        pfVar1 = (float *)((long)(_func_int ***)local_f8._0_8_ +
                          lVar29 + (ulong)((uVar25 & 3) +
                                           (int)(uVar20 >> 3) + (int)((uVar27 & 0xffffffff) / 0xc) +
                                          (uint)(((uint)uVar20 >> 2 & 1) != 0)) *
                                   local_b8 * local_f8._16_8_);
        auVar43._0_4_ = *pfVar21 * *pfVar1 + auVar43._0_4_;
        auVar43._4_4_ = pfVar21[1] * pfVar1[1] + fVar3;
        auVar43._8_4_ = pfVar21[2] * pfVar1[2] + fVar4;
        auVar43._12_4_ = pfVar21[3] * pfVar1[3] + fVar5;
        lVar29 = lVar29 + 0x10;
      }
      auVar78 = vshufpd_avx(auVar43,auVar43,1);
      auVar44._0_4_ = auVar78._0_4_ + auVar43._0_4_;
      auVar44._4_4_ = auVar78._4_4_ + fVar3;
      auVar44._8_4_ = auVar78._8_4_ + fVar4;
      auVar44._12_4_ = auVar78._12_4_ + fVar5;
      auVar43 = vmovshdup_avx(auVar44);
      *(float *)*pauVar34 = auVar43._0_4_ + auVar37._0_4_ + auVar44._0_4_;
      pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
      uVar27 = (ulong)(uVar25 + 1);
    }
  }
  piVar14 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
        free((void *)local_f8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_f8._32_8_)[3])(local_f8._32_8_,local_f8._0_8_,uVar20);
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to1_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 4, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    Mat tmp;
    if (size >= 12)
        tmp.create(12 * maxk, inch, size / 12 + (size % 12) / 8 + (size % 12 % 8) / 4 + size % 12 % 4, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u * 4, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 4, 4, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size / 12;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 12;

            float* tmpptr = tmp.channel(i / 12);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x12
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _r1);
                    _mm_store_ps(tmpptr + 4 * 4, _r5);
                    _mm_store_ps(tmpptr + 4 * 5, _r9);
                    _mm_store_ps(tmpptr + 4 * 6, _r2);
                    _mm_store_ps(tmpptr + 4 * 7, _r6);
                    _mm_store_ps(tmpptr + 4 * 8, _ra);
                    _mm_store_ps(tmpptr + 4 * 9, _r3);
                    _mm_store_ps(tmpptr + 4 * 10, _r7);
                    _mm_store_ps(tmpptr + 4 * 11, _rb);

                    img0 += size * 4;
                    tmpptr += 48;
                }
            }
        }

        remain_size_start += nn_size * 12;
        nn_size = (size - remain_size_start) >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    img0 += size * 4;
                    tmpptr += 16;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    int nn_outch = outch / 4;
    int remain_outch_start = nn_outch * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);
        float* outptr2 = top_blob.channel(p + 2);
        float* outptr3 = top_blob.channel(p + 3);

        const float zeros[4] = {0.f};
        const float* biasptr = bias ? bias + p : zeros;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr);
            __m128 _sum2 = _mm_load1_ps(biasptr);
            __m128 _sum3 = _mm_load1_ps(biasptr + 1);
            __m128 _sum4 = _mm_load1_ps(biasptr + 1);
            __m128 _sum5 = _mm_load1_ps(biasptr + 1);
            __m128 _sum6 = _mm_load1_ps(biasptr + 2);
            __m128 _sum7 = _mm_load1_ps(biasptr + 2);
            __m128 _sum8 = _mm_load1_ps(biasptr + 2);
            __m128 _sum9 = _mm_load1_ps(biasptr + 3);
            __m128 _suma = _mm_load1_ps(biasptr + 3);
            __m128 _sumb = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _val2 = _mm_load_ps(tmpptr + 8);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val0, _w1, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val1, _w1, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val2, _w1, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val0, _w2, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val1, _w2, _sum7);
                _sum8 = _mm_comp_fmadd_ps(_val2, _w2, _sum8);
                _sum9 = _mm_comp_fmadd_ps(_val0, _w3, _sum9);
                _suma = _mm_comp_fmadd_ps(_val1, _w3, _suma);
                _sumb = _mm_comp_fmadd_ps(_val2, _w3, _sumb);

                tmpptr += 12;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr1, _sum3);
            _mm_store_ps(outptr1 + 4, _sum4);
            _mm_store_ps(outptr1 + 8, _sum5);
            _mm_store_ps(outptr2, _sum6);
            _mm_store_ps(outptr2 + 4, _sum7);
            _mm_store_ps(outptr2 + 8, _sum8);
            _mm_store_ps(outptr3, _sum9);
            _mm_store_ps(outptr3 + 4, _suma);
            _mm_store_ps(outptr3 + 8, _sumb);

            outptr0 += 12;
            outptr1 += 12;
            outptr2 += 12;
            outptr3 += 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr);
            __m128 _sum2 = _mm_load1_ps(biasptr + 1);
            __m128 _sum3 = _mm_load1_ps(biasptr + 1);
            __m128 _sum4 = _mm_load1_ps(biasptr + 2);
            __m128 _sum5 = _mm_load1_ps(biasptr + 2);
            __m128 _sum6 = _mm_load1_ps(biasptr + 3);
            __m128 _sum7 = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val0, _w1, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val1, _w1, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val0, _w2, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val1, _w2, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val0, _w3, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val1, _w3, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr1, _sum2);
            _mm_store_ps(outptr1 + 4, _sum3);
            _mm_store_ps(outptr2, _sum4);
            _mm_store_ps(outptr2 + 4, _sum5);
            _mm_store_ps(outptr3, _sum6);
            _mm_store_ps(outptr3 + 4, _sum7);

            outptr0 += 8;
            outptr1 += 8;
            outptr2 += 8;
            outptr3 += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr + 1);
            __m128 _sum2 = _mm_load1_ps(biasptr + 2);
            __m128 _sum3 = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val0, _w1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val0, _w2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val0, _w3, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr1, _sum1);
            _mm_store_ps(outptr2, _sum2);
            _mm_store_ps(outptr3, _sum3);

            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _w0 = _mm_load_ps(kptr0);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            float sum[4];
            _mm_storeu_ps(sum, _sum);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];

            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);
            __m128 _sum1 = _mm_set1_ps(bias0);
            __m128 _sum2 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _val2 = _mm_load_ps(tmpptr + 8);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_w0, _val2, _sum2);

                tmpptr += 12;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);
            _mm_storeu_ps(outptr0 + 4, _sum1);
            _mm_storeu_ps(outptr0 + 8, _sum2);

            outptr0 += 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);
            __m128 _sum1 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);

                tmpptr += 8;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);
            _mm_storeu_ps(outptr0 + 4, _sum1);

            outptr0 += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);

                tmpptr += 4;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);

            outptr0 += 4;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            float sum0 = bias0;

            __m128 _sum0 = _mm_setzero_ps();

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _w0 = _mm_load_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);

                tmpptr += 4;
                kptr0 += 4;
            }

            sum0 += _mm_reduce_add_ps(_sum0);

            outptr0[0] = sum0;

            outptr0 += 1;
        }
    }
}